

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O0

int Ifd_ManFindDsd(Ifd_Man_t *pMan,char *p)

{
  int *pMatches;
  int local_1c;
  char *pcStack_18;
  int Res;
  char *p_local;
  Ifd_Man_t *pMan_local;
  
  pcStack_18 = p;
  p_local = (char *)pMan;
  if ((*p == '0') && (p[1] == '\0')) {
    local_1c = 0;
  }
  else if ((*p == '1') && (p[1] == '\0')) {
    local_1c = 1;
  }
  else {
    pMatches = Ifd_ManComputeMatches(p);
    local_1c = Ifd_ManFindDsd_rec(pMan,p,&stack0xffffffffffffffe8,pMatches);
  }
  if (pcStack_18[1] != '\0') {
    pcStack_18 = pcStack_18 + 1;
    __assert_fail("*++p == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                  ,0x250,"int Ifd_ManFindDsd(Ifd_Man_t *, char *)");
  }
  return local_1c;
}

Assistant:

int Ifd_ManFindDsd( Ifd_Man_t * pMan, char * p )
{
    int Res;
    if ( *p == '0' && *(p+1) == 0 )
        Res = 0;
    else if ( *p == '1' && *(p+1) == 0 )
        Res = 1;
    else
        Res = Ifd_ManFindDsd_rec( pMan, p, &p, Ifd_ManComputeMatches(p) );
    assert( *++p == 0 );
    return Res;
}